

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O3

void helper_sve_ftmad_h_aarch64(void *vd,void *vn,void *vm,void *vs,uint32_t desc)

{
  float16 fVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    lVar2 = (long)((int)desc >> 10) + 8;
    if (-1 < (short)*(ushort *)((long)vm + lVar3)) {
      lVar2 = (long)((int)desc >> 10);
    }
    fVar1 = float16_muladd_aarch64
                      (*(float16 *)((long)vn + lVar3),*(ushort *)((long)vm + lVar3) & 0x7fff,
                       helper_sve_ftmad_h_aarch64::coeff[lVar2],0,(float_status *)vs);
    *(float16 *)((long)vd + lVar3) = fVar1;
    lVar3 = lVar3 + 2;
  } while ((ulong)(desc & 0x1f) * 8 + 8 != lVar3);
  return;
}

Assistant:

void HELPER(sve_ftmad_h)(void *vd, void *vn, void *vm, void *vs, uint32_t desc)
{
    static const float16 coeff[16] = {
        0x3c00, 0xb155, 0x2030, 0x0000, 0x0000, 0x0000, 0x0000, 0x0000,
        0x3c00, 0xb800, 0x293a, 0x0000, 0x0000, 0x0000, 0x0000, 0x0000,
    };
    intptr_t i, opr_sz = simd_oprsz(desc) / sizeof(float16);
    intptr_t x = simd_data(desc);
    float16 *d = vd, *n = vn, *m = vm;
    for (i = 0; i < opr_sz; i++) {
        float16 mm = m[i];
        intptr_t xx = x;
        if (float16_is_neg(mm)) {
            mm = float16_abs(mm);
            xx += 8;
        }
        d[i] = float16_muladd(n[i], mm, coeff[xx], 0, vs);
    }
}